

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O0

bool __thiscall QAccessibleTableHeaderCell::isValid(QAccessibleTableHeaderCell *this)

{
  bool bVar1;
  int iVar2;
  QWidgetPrivate *pQVar3;
  QAbstractItemView *in_RDI;
  long in_FS_OFFSET;
  QAbstractItemModel *theModel;
  QModelIndex rootIndex;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar4;
  undefined2 in_stack_ffffffffffffffb4;
  undefined1 in_stack_ffffffffffffffb6;
  undefined1 in_stack_ffffffffffffffb7;
  QAbstractItemModel *local_48;
  bool local_21;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QAbstractItemView> *)0x7fa60e);
  if (bVar1) {
    ::QPointer::operator_cast_to_QAbstractItemView_((QPointer<QAbstractItemView> *)0x7fa622);
    pQVar3 = qt_widget_private((QWidget *)0x7fa62a);
    if ((*(uint *)&(pQVar3->data).field_0x10 >> 0x12 & 1) == 0) {
      QPointer<QAbstractItemView>::operator->((QPointer<QAbstractItemView> *)0x7fa649);
      local_48 = QAbstractItemView::model(in_RDI);
      goto LAB_007fa661;
    }
  }
  local_48 = (QAbstractItemModel *)0x0;
LAB_007fa661:
  if (local_48 == (QAbstractItemModel *)0x0) {
    local_21 = false;
  }
  else {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QPointer<QAbstractItemView>::operator->((QPointer<QAbstractItemView> *)0x7fa6af);
    QAbstractItemView::rootIndex
              ((QAbstractItemView *)
               CONCAT17(in_stack_ffffffffffffffb7,
                        CONCAT16(in_stack_ffffffffffffffb6,
                                 CONCAT24(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0))));
    local_21 = false;
    if (-1 < *(int *)&(in_RDI->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x18) {
      if (*(int *)&(in_RDI->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x1c == 1) {
        iVar4 = *(int *)&(in_RDI->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x18;
        iVar2 = (**(code **)(*(long *)local_48 + 0x80))(local_48,&local_20);
        local_21 = iVar4 < iVar2;
      }
      else {
        iVar4 = *(int *)&(in_RDI->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x18;
        iVar2 = (**(code **)(*(long *)local_48 + 0x78))(local_48,&local_20);
        local_21 = iVar4 < iVar2;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_21;
}

Assistant:

bool QAccessibleTableHeaderCell::isValid() const
{
    const QAbstractItemModel *theModel = view && !qt_widget_private(view)->data.in_destructor
                                       ? view->model() : nullptr;
    if (!theModel)
        return false;
    const QModelIndex rootIndex = view->rootIndex();
    return (index >= 0) && ((orientation == Qt::Horizontal)
                        ? (index < theModel->columnCount(rootIndex))
                        : (index < theModel->rowCount(rootIndex)));
}